

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeCommitPhaseTwo(Btree *p,int bCleanup)

{
  BtShared *pBt;
  Pager *pPager;
  u8 uVar1;
  uint uVar2;
  
  if (p->inTrans == '\0') {
    return 0;
  }
  sqlite3BtreeEnter(p);
  if (p->inTrans == '\x02') {
    pBt = p->pBt;
    pPager = pBt->pPager;
    uVar2 = pPager->errCode;
    if (uVar2 == 0) {
      if (((pPager->eState == '\x02') && (pPager->exclusiveMode != '\0')) &&
         (pPager->journalMode == '\x01')) {
        uVar2 = 0;
        uVar1 = '\x01';
      }
      else {
        uVar2 = pager_end_transaction(pPager,(uint)pPager->setMaster,1);
        if (((char)uVar2 != '\r') && ((uVar2 & 0xff) != 10)) goto LAB_0011a15a;
        pPager->errCode = uVar2;
        uVar1 = '\x06';
      }
      pPager->eState = uVar1;
    }
LAB_0011a15a:
    if ((bCleanup == 0) && (uVar2 != 0)) goto LAB_0011a17b;
    pBt->inTransaction = '\x01';
    btreeClearHasContent(pBt);
  }
  btreeEndTransaction(p);
  uVar2 = 0;
LAB_0011a17b:
  sqlite3BtreeLeave(p);
  return uVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCommitPhaseTwo(Btree *p, int bCleanup){

  if( p->inTrans==TRANS_NONE ) return SQLITE_OK;
  sqlite3BtreeEnter(p);
  btreeIntegrity(p);

  /* If the handle has a write-transaction open, commit the shared-btrees 
  ** transaction and set the shared state to TRANS_READ.
  */
  if( p->inTrans==TRANS_WRITE ){
    int rc;
    BtShared *pBt = p->pBt;
    assert( pBt->inTransaction==TRANS_WRITE );
    assert( pBt->nTransaction>0 );
    rc = sqlite3PagerCommitPhaseTwo(pBt->pPager);
    if( rc!=SQLITE_OK && bCleanup==0 ){
      sqlite3BtreeLeave(p);
      return rc;
    }
    pBt->inTransaction = TRANS_READ;
    btreeClearHasContent(pBt);
  }

  btreeEndTransaction(p);
  sqlite3BtreeLeave(p);
  return SQLITE_OK;
}